

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

void __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
process_octal(Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this)

{
  int iVar1;
  char *__nptr;
  char __c;
  int *piVar2;
  longlong lVar3;
  undefined8 uVar4;
  char *local_30;
  
  if ((this->octal_matches)._M_string_length == 0) goto LAB_0031e059;
  __nptr = (this->octal_matches)._M_dataplus._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtoll(__nptr,&local_30,8);
  __c = (char)lVar3;
  if (local_30 == __nptr) {
    uVar4 = std::__throw_invalid_argument("stoll");
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    _Unwind_Resume(uVar4);
  }
  if (*piVar2 == 0) {
LAB_0031e04b:
    *piVar2 = iVar1;
  }
  else if (*piVar2 == 0x22) {
    __c = std::__throw_out_of_range("stoll");
    goto LAB_0031e04b;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (this->match,__c);
LAB_0031e059:
  (this->octal_matches)._M_string_length = 0;
  *(this->octal_matches)._M_dataplus._M_p = '\0';
  this->is_escaped = false;
  this->is_octal = false;
  return;
}

Assistant:

void process_octal() {
          if (!octal_matches.empty()) {
            auto val = stoll(octal_matches, nullptr, 8);
            match.push_back(char_type(val));
          }
          octal_matches.clear();
          is_escaped = false;
          is_octal = false;
        }